

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Lookup
          (PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          float_na_equal *value)

{
  float fVar1;
  float fVar2;
  hash_t hVar3;
  ulong uVar4;
  primitive_dictionary_entry_t *ppVar5;
  uint uVar6;
  
  uVar6 = -(uint)NAN(*(float *)value);
  hVar3 = Hash<float>((float)(~uVar6 & (uint)*(float *)value | uVar6 & 0x7fc00000));
  uVar4 = hVar3 & this->capacity_mask;
  ppVar5 = this->dictionary + uVar4;
  if (ppVar5->index != 0xffffffff) {
    fVar1 = *(float *)value;
    do {
      fVar2 = *(float *)ppVar5;
      if (NAN(fVar2) && NAN(fVar1)) {
        return ppVar5;
      }
      if ((fVar2 == fVar1) && (!NAN(fVar2) && !NAN(fVar1))) {
        return ppVar5;
      }
      uVar4 = uVar4 + 1 & this->capacity_mask;
      ppVar5 = this->dictionary + uVar4;
    } while (ppVar5->index != 0xffffffff);
  }
  return ppVar5;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}